

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

FilePath * testing::internal::GetCurrentExecutableName(void)

{
  size_type *psVar1;
  char *pcVar2;
  long lVar3;
  char cVar4;
  FilePath *in_RDI;
  undefined1 local_78 [8];
  FilePath result;
  char *local_40;
  long local_38;
  char local_30 [16];
  
  psVar1 = &result.pathname_._M_string_length;
  result.pathname_._M_dataplus._M_p = (pointer)0x0;
  result.pathname_._M_string_length._0_1_ = 0;
  local_78 = (undefined1  [8])psVar1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&result.pathname_.field_2 + 8),
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)g_argvs_abi_cxx11_);
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,*(long *)result.pathname_.field_2._8_8_,
             *(long *)(result.pathname_.field_2._8_8_ + 8) + *(long *)result.pathname_.field_2._8_8_
            );
  pcVar2 = local_40;
  if (local_38 != 0) {
    lVar3 = 0;
    do {
      cVar4 = local_40[lVar3];
      if (((cVar4 != '/') || (cVar4 = '/', pcVar2 == local_40)) || (pcVar2[-1] != '/')) {
        *pcVar2 = cVar4;
        pcVar2 = pcVar2 + 1;
      }
      lVar3 = lVar3 + 1;
    } while (local_38 != lVar3);
  }
  local_38 = (long)pcVar2 - (long)local_40;
  *pcVar2 = '\0';
  std::__cxx11::string::_M_assign((string *)local_78);
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&result.pathname_.field_2 + 8));
  FilePath::RemoveDirectoryName(in_RDI,(FilePath *)local_78);
  if (local_78 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_78);
  }
  return in_RDI;
}

Assistant:

FilePath GetCurrentExecutableName() {
  FilePath result;

#if GTEST_OS_WINDOWS || GTEST_OS_OS2
  result.Set(FilePath(GetArgvs()[0]).RemoveExtension("exe"));
#else
  result.Set(FilePath(GetArgvs()[0]));
#endif  // GTEST_OS_WINDOWS

  return result.RemoveDirectoryName();
}